

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

void __thiscall
proto2_unittest::TestOneofParsingLite::set_allocated_oneof_submessage
          (TestOneofParsingLite *this,TestAllTypesLite *oneof_submessage)

{
  Arena *message_arena_00;
  Arena *submessage_arena_00;
  Arena *submessage_arena;
  Arena *message_arena;
  TestAllTypesLite *oneof_submessage_local;
  TestOneofParsingLite *this_local;
  
  message_arena_00 = google::protobuf::MessageLite::GetArena(&this->super_MessageLite);
  clear_oneof_field(this);
  if (oneof_submessage != (TestAllTypesLite *)0x0) {
    submessage_arena_00 =
         google::protobuf::MessageLite::GetArena(&oneof_submessage->super_MessageLite);
    message_arena = (Arena *)oneof_submessage;
    if (message_arena_00 != submessage_arena_00) {
      message_arena =
           (Arena *)google::protobuf::internal::GetOwnedMessage<proto2_unittest::TestAllTypesLite>
                              (message_arena_00,oneof_submessage,submessage_arena_00);
    }
    set_has_oneof_submessage(this);
    (this->field_0)._impl_.oneof_field_.oneof_submessage_ = (TestAllTypesLite *)message_arena;
  }
  return;
}

Assistant:

void TestOneofParsingLite::set_allocated_oneof_submessage(::proto2_unittest::TestAllTypesLite* PROTOBUF_NULLABLE oneof_submessage) {
  ::google::protobuf::Arena* message_arena = GetArena();
  clear_oneof_field();
  if (oneof_submessage) {
    ::google::protobuf::Arena* submessage_arena = oneof_submessage->GetArena();
    if (message_arena != submessage_arena) {
      oneof_submessage = ::google::protobuf::internal::GetOwnedMessage(message_arena, oneof_submessage, submessage_arena);
    }
    set_has_oneof_submessage();
    _impl_.oneof_field_.oneof_submessage_ = oneof_submessage;
  }
  // @@protoc_insertion_point(field_set_allocated:proto2_unittest.TestOneofParsingLite.oneof_submessage)
}